

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void doctest::detail::registerReporterImpl
               (char *name,int priority,reporterCreatorFunc c,bool isReporter)

{
  undefined3 in_register_00000009;
  pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>
  local_68;
  int local_40;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  local_68.second = c;
  local_40 = priority;
  if (CONCAT31(in_register_00000009,isReporter) == 0) {
    anon_unknown_14::getListeners();
    String::String((String *)&local_38.data,name);
    local_68.first.first = local_40;
    local_68.first.second.field_0._8_8_ = local_38._8_8_;
    local_38.buf[0] = '\0';
    local_38.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_14::getListeners::data,&local_68);
  }
  else {
    anon_unknown_14::getReporters();
    String::String((String *)&local_38.data,name);
    local_68.first.first = local_40;
    local_68.first.second.field_0._8_8_ = local_38._8_8_;
    local_38.buf[0] = '\0';
    local_38.buf[0x17] = '\x17';
    std::
    _Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
    ::
    _M_insert_unique<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>
              ((_Rb_tree<std::pair<int,doctest::String>,std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>,std::_Select1st<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>,std::less<std::pair<int,doctest::String>>,std::allocator<std::pair<std::pair<int,doctest::String>const,doctest::IReporter*(*)(doctest::ContextOptions_const&)>>>
                *)&anon_unknown_14::getReporters::data,&local_68);
  }
  String::~String(&local_68.first.second);
  String::~String((String *)&local_38.data);
  return;
}

Assistant:

void registerReporterImpl(const char* name, int priority, reporterCreatorFunc c, bool isReporter) {
        if(isReporter)
            getReporters().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
        else
            getListeners().insert(reporterMap::value_type(reporterMap::key_type(priority, name), c));
    }